

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O0

string * __thiscall
t_rs_generator::service_call_args_struct_name_abi_cxx11_
          (string *__return_storage_ptr__,t_rs_generator *this,t_function *tfunc)

{
  int iVar1;
  t_struct *ptVar2;
  undefined4 extraout_var;
  string local_60;
  string local_40;
  t_function *local_20;
  t_function *tfunc_local;
  t_rs_generator *this_local;
  
  local_20 = tfunc;
  tfunc_local = (t_function *)this;
  this_local = (t_rs_generator *)__return_storage_ptr__;
  rust_camel_case(&local_40,this,&(this->super_t_generator).service_name_);
  ptVar2 = t_function::get_arglist(local_20);
  iVar1 = (*(ptVar2->super_t_type).super_t_doc._vptr_t_doc[3])();
  rust_camel_case(&local_60,this,(string *)CONCAT44(extraout_var,iVar1));
  std::operator+(__return_storage_ptr__,&local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

string t_rs_generator::service_call_args_struct_name(t_function* tfunc) {
  // Thrift automatically appends `Args` to the arglist name. No need to do it here.
  return rust_camel_case(service_name_) + rust_camel_case(tfunc->get_arglist()->get_name());
}